

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void StoreSymbol(BlockEncoder *self,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  sVar5 = self->block_len_;
  if (sVar5 == 0) {
    sVar5 = self->block_ix_;
    self->block_ix_ = sVar5 + 1;
    uVar2 = self->block_lengths_[sVar5 + 1];
    uVar9 = (ulong)self->block_types_[sVar5 + 1];
    self->block_len_ = (ulong)uVar2;
    self->entropy_ix_ = self->histogram_length_ * uVar9;
    sVar5 = (self->block_split_code_).type_code_calculator.last_type;
    lVar6 = 1;
    if (sVar5 + 1 != uVar9) {
      lVar6 = 0;
      if ((self->block_split_code_).type_code_calculator.second_last_type != uVar9) {
        lVar6 = uVar9 + 2;
      }
    }
    (self->block_split_code_).type_code_calculator.second_last_type = sVar5;
    (self->block_split_code_).type_code_calculator.last_type = uVar9;
    uVar9 = *storage_ix;
    uVar7 = (self->block_split_code_).type_depths[lVar6] + uVar9;
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)(self->block_split_code_).type_bits[lVar6] << ((byte)uVar9 & 7) |
         (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar7;
    uVar9 = 0xe;
    if (0x2f0 < uVar2) {
      uVar9 = 0x14;
    }
    uVar8 = 7;
    if (uVar2 < 0x29) {
      uVar8 = 0;
    }
    if (0xb0 < uVar2) {
      uVar8 = uVar9;
    }
    do {
      uVar9 = uVar8;
      if (uVar9 == 0x19) break;
      uVar8 = uVar9 + 1;
    } while (kBlockLengthPrefixCode[uVar9 + 1].offset <= uVar2);
    uVar9 = uVar9 & 0xffffffff;
    uVar3 = kBlockLengthPrefixCode[uVar9].nbits;
    uVar4 = kBlockLengthPrefixCode[uVar9].offset;
    bVar1 = (self->block_split_code_).length_depths[uVar9];
    *(ulong *)(storage + (uVar7 >> 3)) =
         (ulong)(self->block_split_code_).length_bits[uVar9] << ((byte)uVar7 & 7) |
         (ulong)storage[uVar7 >> 3];
    uVar7 = bVar1 + uVar7;
    *storage_ix = uVar7;
    *(ulong *)(storage + (uVar7 >> 3)) =
         (ulong)(uVar2 - uVar4) << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
    *storage_ix = uVar7 + uVar3;
    sVar5 = self->block_len_;
  }
  self->block_len_ = sVar5 - 1;
  lVar6 = symbol + self->entropy_ix_;
  bVar1 = self->depths_[lVar6];
  uVar9 = *storage_ix;
  *(ulong *)(storage + (uVar9 >> 3)) =
       (ulong)self->bits_[lVar6] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
  *storage_ix = bVar1 + uVar9;
  return;
}

Assistant:

static void StoreSymbol(BlockEncoder* self, size_t symbol, size_t* storage_ix,
    uint8_t* storage) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = block_type * self->histogram_length_;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t ix = self->entropy_ix_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}